

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRedCostViolation
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *maxviol,
          number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *sumviol)

{
  uint uVar1;
  uint *puVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  pointer pnVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  type_conflict5 tVar13;
  VarStatus VVar14;
  uint uVar15;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_78;
  cpp_dec_float<50U,_int,_void> *local_40;
  uint *local_38;
  
  bVar3 = this->_hasBasis;
  if (bVar3 == true) {
    local_40 = &sumviol->m_backend;
    _syncRealSolution(this);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)maxviol,0.0);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)local_40,0.0);
    local_38 = (maxviol->m_backend).data._M_elems + 1;
    uVar15 = (this->_realLP->
             super_LPColSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.thenum;
    while (0 < (int)uVar15) {
      uVar1 = uVar15 - 1;
      VVar14 = basisColStatus(this,uVar15 - 1);
      uVar15 = uVar1;
      if (this->_currentSettings->_intParamValues[0] == -1) {
        if ((VVar14 & ~FIXED) != ON_UPPER) {
          local_78.data._M_elems[0] = 0;
          local_78.data._M_elems[1] = 0;
          tVar13 = boost::multiprecision::operator<
                             ((this->_solReal)._redCost.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar1,(double *)&local_78)
          ;
          if (tVar13) {
            pnVar10 = (this->_solReal)._redCost.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_78.data._M_elems._32_8_ =
                 *(undefined8 *)((long)&pnVar10[uVar1].m_backend.data + 0x20);
            local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[uVar1].m_backend.data;
            local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar10[uVar1].m_backend.data + 8)
            ;
            puVar2 = (uint *)((long)&pnVar10[uVar1].m_backend.data + 0x10);
            local_78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_78.exp = pnVar10[uVar1].m_backend.exp;
            local_78.neg = pnVar10[uVar1].m_backend.neg;
            local_78.fpclass = pnVar10[uVar1].m_backend.fpclass;
            local_78.prec_elem = pnVar10[uVar1].m_backend.prec_elem;
            if (local_78.fpclass != cpp_dec_float_finite || local_78.data._M_elems[0] != 0) {
              local_78.neg = (bool)(local_78.neg ^ 1);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_40,&local_78);
            local_78.data._M_elems._32_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 8);
            local_78.data._M_elems._0_8_ = *(undefined8 *)(maxviol->m_backend).data._M_elems;
            local_78.data._M_elems._8_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 2);
            local_78.data._M_elems._16_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 4);
            local_78.data._M_elems._24_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 6);
            local_78.exp = (maxviol->m_backend).exp;
            local_78.neg = (maxviol->m_backend).neg;
            local_78.fpclass = (maxviol->m_backend).fpclass;
            local_78.prec_elem = (maxviol->m_backend).prec_elem;
            if (local_78.fpclass != cpp_dec_float_finite || local_78.data._M_elems[0] != 0) {
              local_78.neg = (bool)(local_78.neg ^ 1);
            }
            tVar13 = boost::multiprecision::operator<
                               ((this->_solReal)._redCost.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar1,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_78);
            if (tVar13) {
              pnVar10 = (this->_solReal)._redCost.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = pnVar10[uVar1].m_backend.data._M_elems[0];
              uVar6 = *(uint *)((long)&pnVar10[uVar1].m_backend.data + 0x24);
              local_78.data._M_elems[8] = uVar6;
              puVar2 = (uint *)((long)&pnVar10[uVar1].m_backend.data + 0x14);
              local_78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)&pnVar10[uVar1].m_backend.data + 4);
              local_78.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_78.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              iVar7 = pnVar10[uVar1].m_backend.exp;
              uVar9 = pnVar10[uVar1].m_backend.fpclass;
              uVar12 = pnVar10[uVar1].m_backend.prec_elem;
              bVar4 = pnVar10[uVar1].m_backend.neg;
              (maxviol->m_backend).data._M_elems[0] = uVar5;
              local_38[8] = uVar6;
              *(undefined8 *)(local_38 + 4) = local_78.data._M_elems._16_8_;
              *(undefined8 *)(local_38 + 6) = local_78.data._M_elems._24_8_;
              *(undefined8 *)local_38 = local_78.data._M_elems._0_8_;
              *(undefined8 *)(local_38 + 2) = local_78.data._M_elems._8_8_;
              (maxviol->m_backend).exp = iVar7;
              (maxviol->m_backend).neg = (bool)((uVar5 != 0 || uVar9 != 0) ^ bVar4);
              (maxviol->m_backend).fpclass = uVar9;
              (maxviol->m_backend).prec_elem = uVar12;
            }
          }
        }
        if (VVar14 - ZERO < 0xfffffffe) {
          local_78.data._M_elems[0] = 0;
          local_78.data._M_elems[1] = 0;
          tVar13 = boost::multiprecision::operator>
                             ((this->_solReal)._redCost.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar1,(double *)&local_78)
          ;
          if (tVar13) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_40,&(this->_solReal)._redCost.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            tVar13 = boost::multiprecision::operator>
                               ((this->_solReal)._redCost.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar1,maxviol);
            if (tVar13) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        (&maxviol->m_backend,
                         &(this->_solReal)._redCost.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            }
          }
        }
      }
      else {
        if ((VVar14 & ~FIXED) != ON_UPPER) {
          local_78.data._M_elems[0] = 0;
          local_78.data._M_elems[1] = 0;
          tVar13 = boost::multiprecision::operator>
                             ((this->_solReal)._redCost.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar1,(double *)&local_78)
          ;
          if (tVar13) {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_40,&(this->_solReal)._redCost.val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            tVar13 = boost::multiprecision::operator>
                               ((this->_solReal)._redCost.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar1,maxviol);
            if (tVar13) {
              boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                        (&maxviol->m_backend,
                         &(this->_solReal)._redCost.val.
                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar1].m_backend);
            }
          }
        }
        if (VVar14 - ZERO < 0xfffffffe) {
          local_78.data._M_elems[0] = 0;
          local_78.data._M_elems[1] = 0;
          tVar13 = boost::multiprecision::operator<
                             ((this->_solReal)._redCost.val.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar1,(double *)&local_78)
          ;
          if (tVar13) {
            pnVar10 = (this->_solReal)._redCost.val.
                      super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_78.data._M_elems._32_8_ =
                 *(undefined8 *)((long)&pnVar10[uVar1].m_backend.data + 0x20);
            local_78.data._M_elems._0_8_ = *(undefined8 *)&pnVar10[uVar1].m_backend.data;
            local_78.data._M_elems._8_8_ = *(undefined8 *)((long)&pnVar10[uVar1].m_backend.data + 8)
            ;
            puVar2 = (uint *)((long)&pnVar10[uVar1].m_backend.data + 0x10);
            local_78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
            local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
            local_78.exp = pnVar10[uVar1].m_backend.exp;
            local_78.neg = pnVar10[uVar1].m_backend.neg;
            local_78.fpclass = pnVar10[uVar1].m_backend.fpclass;
            local_78.prec_elem = pnVar10[uVar1].m_backend.prec_elem;
            if (local_78.fpclass != cpp_dec_float_finite || local_78.data._M_elems[0] != 0) {
              local_78.neg = (bool)(local_78.neg ^ 1);
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                      (local_40,&local_78);
            local_78.data._M_elems._32_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 8);
            local_78.data._M_elems._0_8_ = *(undefined8 *)(maxviol->m_backend).data._M_elems;
            local_78.data._M_elems._8_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 2);
            local_78.data._M_elems._16_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 4);
            local_78.data._M_elems._24_8_ = *(undefined8 *)((maxviol->m_backend).data._M_elems + 6);
            local_78.exp = (maxviol->m_backend).exp;
            local_78.neg = (maxviol->m_backend).neg;
            local_78.fpclass = (maxviol->m_backend).fpclass;
            local_78.prec_elem = (maxviol->m_backend).prec_elem;
            if (local_78.fpclass != cpp_dec_float_finite || local_78.data._M_elems[0] != 0) {
              local_78.neg = (bool)(local_78.neg ^ 1);
            }
            tVar13 = boost::multiprecision::operator<
                               ((this->_solReal)._redCost.val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_start + uVar1,
                                (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                                 *)&local_78);
            if (tVar13) {
              pnVar10 = (this->_solReal)._redCost.val.
                        super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              uVar5 = pnVar10[uVar1].m_backend.data._M_elems[0];
              uVar6 = *(uint *)((long)&pnVar10[uVar1].m_backend.data + 0x24);
              local_78.data._M_elems[8] = uVar6;
              puVar2 = (uint *)((long)&pnVar10[uVar1].m_backend.data + 0x14);
              local_78.data._M_elems._16_8_ = *(undefined8 *)puVar2;
              local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
              puVar2 = (uint *)((long)&pnVar10[uVar1].m_backend.data + 4);
              local_78.data._M_elems._0_8_ = *(undefined8 *)puVar2;
              local_78.data._M_elems._8_8_ = *(undefined8 *)(puVar2 + 2);
              iVar7 = pnVar10[uVar1].m_backend.exp;
              uVar8 = pnVar10[uVar1].m_backend.fpclass;
              uVar11 = pnVar10[uVar1].m_backend.prec_elem;
              bVar4 = pnVar10[uVar1].m_backend.neg;
              (maxviol->m_backend).data._M_elems[0] = uVar5;
              local_38[8] = uVar6;
              *(undefined8 *)(local_38 + 4) = local_78.data._M_elems._16_8_;
              *(undefined8 *)(local_38 + 6) = local_78.data._M_elems._24_8_;
              *(undefined8 *)local_38 = local_78.data._M_elems._0_8_;
              *(undefined8 *)(local_38 + 2) = local_78.data._M_elems._8_8_;
              (maxviol->m_backend).exp = iVar7;
              (maxviol->m_backend).neg = (bool)((uVar5 != 0 || uVar8 != 0) ^ bVar4);
              (maxviol->m_backend).fpclass = uVar8;
              (maxviol->m_backend).prec_elem = uVar11;
            }
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool SoPlexBase<R>::getRedCostViolation(R& maxviol, R& sumviol)
{
   if(!hasBasis())
      return false;

   _syncRealSolution();
   VectorBase<R>& redcost = _solReal._redCost;
   assert(redcost.dim() == numCols());

   maxviol = 0.0;
   sumviol = 0.0;

   for(int c = numCols() - 1; c >= 0; c--)
   {
      typename SPxSolverBase<R>::VarStatus colStatus = basisColStatus(c);

      if(intParam(SoPlexBase<R>::OBJSENSE) == OBJSENSE_MINIMIZE)
      {
         if(colStatus != SPxSolverBase<R>::ON_UPPER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] < 0.0)
         {
            sumviol += -redcost[c];

            if(redcost[c] < -maxviol)
               maxviol = -redcost[c];
         }

         if(colStatus != SPxSolverBase<R>::ON_LOWER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] > 0.0)
         {
            sumviol += redcost[c];

            if(redcost[c] > maxviol)
               maxviol = redcost[c];
         }
      }
      else
      {
         if(colStatus != SPxSolverBase<R>::ON_UPPER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] > 0.0)
         {
            sumviol += redcost[c];

            if(redcost[c] > maxviol)
               maxviol = redcost[c];
         }

         if(colStatus != SPxSolverBase<R>::ON_LOWER && colStatus != SPxSolverBase<R>::FIXED
               && redcost[c] < 0.0)
         {
            sumviol += -redcost[c];

            if(redcost[c] < -maxviol)
               maxviol = -redcost[c];
         }
      }
   }

   return true;
}